

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getnameinfo.c
# Opt level: O3

int run_test_getnameinfo_basic_ip4(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  undefined8 uVar3;
  sockaddr_in *in_RCX;
  long extraout_RDX;
  undefined8 unaff_RBX;
  int iVar4;
  char *pcVar5;
  undefined8 in_R9;
  
  pcVar5 = "127.0.0.1";
  iVar4 = 0x50;
  iVar1 = uv_ip4_addr("127.0.0.1",0x50,&addr4);
  if (iVar1 == 0) {
    pcVar5 = (char *)uv_default_loop();
    iVar4 = 0x2e5080;
    in_RCX = &addr4;
    iVar1 = uv_getnameinfo(pcVar5,&req,getnameinfo_req,&addr4,0);
    if (iVar1 != 0) goto LAB_0015babe;
    uVar2 = uv_default_loop();
    uv_run(uVar2,0);
    unaff_RBX = uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,0);
    iVar4 = 0;
    uv_run(unaff_RBX);
    pcVar5 = (char *)uv_default_loop();
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_getnameinfo_basic_ip4_cold_1();
LAB_0015babe:
    run_test_getnameinfo_basic_ip4_cold_2();
  }
  run_test_getnameinfo_basic_ip4_cold_3();
  if (pcVar5 == (char *)0x0) {
    getnameinfo_req_cold_4();
LAB_0015bae3:
    getnameinfo_req_cold_1();
LAB_0015bae8:
    getnameinfo_req_cold_3();
  }
  else {
    if (iVar4 != 0) goto LAB_0015bae3;
    if (extraout_RDX == 0) goto LAB_0015bae8;
    if (in_RCX != (sockaddr_in *)0x0) {
      return extraout_EAX;
    }
  }
  getnameinfo_req_cold_2();
  uVar2 = unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x50,&addr4);
  if (iVar1 == 0) {
    uVar3 = uv_default_loop();
    iVar1 = uv_getnameinfo(uVar3,&req,0,&addr4,0,in_R9,uVar2);
    if (iVar1 != 0) goto LAB_0015bb82;
    if (req.host[0] == '\0') goto LAB_0015bb87;
    if (req.service[0] == '\0') goto LAB_0015bb8c;
    unaff_RBX = uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,0);
    uv_run(unaff_RBX,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_getnameinfo_basic_ip4_sync_cold_1();
LAB_0015bb82:
    run_test_getnameinfo_basic_ip4_sync_cold_2();
LAB_0015bb87:
    run_test_getnameinfo_basic_ip4_sync_cold_5();
LAB_0015bb8c:
    run_test_getnameinfo_basic_ip4_sync_cold_4();
  }
  run_test_getnameinfo_basic_ip4_sync_cold_3();
  pcVar5 = "::1";
  iVar1 = uv_ip6_addr("::1",0x50,&addr6);
  if (iVar1 == 0) {
    pcVar5 = (char *)uv_default_loop();
    iVar1 = uv_getnameinfo(pcVar5,&req,getnameinfo_req,&addr6,0,in_R9,unaff_RBX);
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      pcVar5 = (char *)uv_default_loop();
      iVar1 = uv_loop_close(pcVar5);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0015bc2d;
    }
  }
  else {
    run_test_getnameinfo_basic_ip6_cold_1();
  }
  run_test_getnameinfo_basic_ip6_cold_2();
LAB_0015bc2d:
  run_test_getnameinfo_basic_ip6_cold_3();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(pcVar5,0);
  return iVar1;
}

Assistant:

TEST_IMPL(getnameinfo_basic_ip4) {
  int r;

  r = uv_ip4_addr(address_ip4, port, &addr4);
  ASSERT(r == 0);

  r = uv_getnameinfo(uv_default_loop(),
                     &req,
                     &getnameinfo_req,
                     (const struct sockaddr*)&addr4,
                     0);
  ASSERT(r == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}